

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.cpp
# Opt level: O1

int __thiscall derick::shoot(derick *this)

{
  int iVar1;
  
  iVar1 = (this->super_warrior).ammo;
  if (iVar1 < 2) {
    if (iVar1 == 1) {
      (this->super_warrior).ammo = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"One Shot Is Fired!\n",0x13);
      iVar1 = 1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "The Hammer Falls..........But No Shots Are Heard, Out of Ammo!\n",0x3f);
      iVar1 = 0;
    }
  }
  else {
    (this->super_warrior).ammo = iVar1 + -2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Two Shots Are Fired!\n",0x15);
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int derick::shoot() {
    //function to attempt to shoot bullets, returns number of bullets fired
    //returns 2 if 2 bullets fired
    //returns 1 if 1 bullet fired
    //returns 0 if out of ammo
    if (getAmmo() > 1) {
        consumeAmmo(2);
        std::cout << "Two Shots Are Fired!\n";
        return 2;
    } else if (getAmmo() == 1) {
        consumeAmmo(1);
        std::cout << "One Shot Is Fired!\n";
        return 1;
    } else
        std::cout << "The Hammer Falls..........But No Shots Are Heard, Out of Ammo!\n";
        return 0;
}